

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O0

void t9(void)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  char *script;
  uint32_t p [10];
  int e;
  int c;
  int oc;
  int s;
  char *in_stack_ffffffffffffffb8;
  char *pcVar4;
  int pc;
  int iVar5;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint local_14;
  
  printf("Script store/run/status/stop/delete tests.\n");
  gpio_write(0x19,0);
  pcVar4 = "   ld p9 p0   tag 0   w p1 1   mils 5   w p1 0   mils 5   dcr p9   jp 0";
  callback(0x19,0,t9cbf);
  uVar1 = store_script(pcVar4);
  do {
    time_sleep(0x3fb999999999999a);
    iVar2 = script_status(uVar1,&stack0xffffffffffffffc8);
  } while (iVar2 == 0);
  iVar2 = 99;
  iVar5 = 0x19;
  run_script(uVar1,2,&stack0xffffffffffffffc8);
  time_sleep(0x4000000000000000);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,(int)((ulong)pcVar4 >> 0x20)
        ,in_stack_ffffffffffffffb8);
  iVar2 = 200;
  iVar5 = 0x19;
  run_script(uVar1,2,&stack0xffffffffffffffc8);
  do {
    time_sleep(0x3fb999999999999a);
    iVar3 = script_status(uVar1,&stack0xffffffffffffffc8);
  } while (iVar3 == 2);
  time_sleep(0x3fb999999999999a);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,(int)((ulong)pcVar4 >> 0x20)
        ,in_stack_ffffffffffffffb8);
  iVar2 = 2000;
  iVar5 = 0x19;
  run_script(uVar1,2,&stack0xffffffffffffffc8);
  while( true ) {
    time_sleep(0x3fb999999999999a);
    iVar3 = script_status(uVar1,&stack0xffffffffffffffc8);
    pc = (int)((ulong)pcVar4 >> 0x20);
    if (iVar3 != 2) break;
    if (local_14 < 0x640) {
      stop_script(uVar1);
    }
  }
  time_sleep(0x3fb999999999999a);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,pc,in_stack_ffffffffffffffb8
       );
  delete_script(uVar1);
  CHECK(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar5,iVar2,pc,in_stack_ffffffffffffffb8
       );
  return;
}

Assistant:

void t9()
{
   int s, oc, c, e;
   uint32_t p[10];

   printf("Script store/run/status/stop/delete tests.\n");

   gpio_write(GPIO, 0); /* need known state */

   /*
   100 loops per second
   p0 number of loops
   p1 GPIO
   */
   char *script="\
   ld p9 p0\
   tag 0\
   w p1 1\
   mils 5\
   w p1 0\
   mils 5\
   dcr p9\
   jp 0";

   callback(GPIO, RISING_EDGE, t9cbf);

   s = store_script(script);

   /* Wait for script to finish initing. */
   while (1)
   {
      time_sleep(0.1);
      e = script_status(s, p);
      if (e != PI_SCRIPT_INITING) break;
   }

   oc = t9_count;
   p[0] = 99;
   p[1] = GPIO;
   run_script(s, 2, p);
   time_sleep(2);
   c = t9_count - oc;
   CHECK(9, 1, c, 100, 0, "store/run script");

   oc = t9_count;
   p[0] = 200;
   p[1] = GPIO;
   run_script(s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 2, c, 201, 0, "run script/script status");

   oc = t9_count;
   p[0] = 2000;
   p[1] = GPIO;
   run_script(s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      if (p[9] < 1600) stop_script(s);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 3, c, 410, 10, "run/stop script/script status");

   e = delete_script(s);
   CHECK(9, 4, e, 0, 0, "delete script");
}